

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsScissorTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gls::Functional::anon_unknown_0::FramebufferClearCase::iterate(FramebufferClearCase *this)

{
  pointer log;
  RenderContext *renderCtx;
  Color color;
  Color color_00;
  bool bVar1;
  int iVar2;
  ContextType type;
  GLSLVersion version;
  uint uVar3;
  GLenum GVar4;
  undefined4 extraout_var;
  ObjectTraits *pOVar5;
  char *description;
  float depth;
  long lVar6;
  int iVar7;
  IVec4 scissorArea;
  PixelBufferAccess refAccess;
  vector<unsigned_char,_std::allocator<unsigned_char>_> resData;
  vector<unsigned_char,_std::allocator<unsigned_char>_> refData;
  Renderbuffer depthbuf;
  Renderbuffer colorbuf;
  Framebuffer fbo;
  PixelBufferAccess resAccess;
  Vector<int,_4> res;
  ShaderProgram shader;
  undefined4 local_3a8;
  undefined4 local_3a4;
  undefined4 local_3a0;
  undefined4 local_39c;
  Vector<int,_4> local_398;
  TextureFormat local_388;
  uint local_380;
  ConstPixelBufferAccess local_378;
  float local_350;
  undefined4 uStack_34c;
  undefined4 uStack_348;
  undefined4 uStack_344;
  undefined4 local_340;
  float local_338;
  undefined4 uStack_334;
  undefined4 uStack_330;
  undefined4 uStack_32c;
  undefined4 local_328;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_320;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_308;
  ObjectWrapper local_2f0;
  ObjectWrapper local_2d8;
  ObjectWrapper local_2c0;
  ConstPixelBufferAccess local_2a8;
  undefined1 local_280 [8];
  undefined8 uStack_278;
  ios_base local_208 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_1f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d0 [8];
  ShaderProgram local_100;
  Functions *gl;
  
  log = (pointer)((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  iVar2 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar2);
  renderCtx = this->m_renderCtx;
  type.super_ApiType.m_bits = (ApiType)(*renderCtx->_vptr_RenderContext[2])(renderCtx);
  version = glu::getContextTypeGLSLVersion(type);
  genShaders((ProgramSources *)local_280,version);
  glu::ShaderProgram::ShaderProgram(&local_100,renderCtx,(ProgramSources *)local_280);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(local_1d0);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_1f0);
  lVar6 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_280 + lVar6));
    lVar6 = lVar6 + -0x18;
  } while (lVar6 != -0x18);
  pOVar5 = glu::objectTraits(OBJECTTYPE_FRAMEBUFFER);
  glu::ObjectWrapper::ObjectWrapper(&local_2c0,gl,pOVar5);
  pOVar5 = glu::objectTraits(OBJECTTYPE_RENDERBUFFER);
  glu::ObjectWrapper::ObjectWrapper(&local_2d8,gl,pOVar5);
  pOVar5 = glu::objectTraits(OBJECTTYPE_RENDERBUFFER);
  glu::ObjectWrapper::ObjectWrapper(&local_2f0,gl,pOVar5);
  uVar3 = this->m_clearType - CLEAR_COLOR_FLOAT;
  if (uVar3 < 3) {
    local_388 = *(TextureFormat *)(&DAT_01cf8b00 + (ulong)uVar3 * 8);
    local_380 = *(uint *)(&DAT_01cf8b18 + (ulong)uVar3 * 4);
  }
  else {
    local_380 = 0x8058;
    local_388.order = RGBA;
    local_388.type = UNORM_INT8;
  }
  if ((local_380 & 0xffff) == 0x8d7c) {
    depth = 2.8026e-45;
  }
  else {
    if ((local_380 & 0xffff) != 0x8d8e) {
      local_3a8 = 0x3e000000;
      local_3a4 = 0x3e800000;
      local_3a0 = 0x3f000000;
      local_39c = 0x3f800000;
      depth = 0.0;
      goto LAB_0186b846;
    }
    depth = 1.4013e-45;
  }
  local_39c = 0;
  local_3a0 = 0;
  local_3a4 = 0;
  local_3a8 = 0;
LAB_0186b846:
  local_398.m_data[0] = 8;
  local_398.m_data[1] = 8;
  local_398.m_data[2] = 0x30;
  local_398.m_data[3] = 0x30;
  iVar2 = tcu::TextureFormat::getPixelSize(&local_388);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_308,(long)(iVar2 << 0xc),(allocator_type *)local_280);
  iVar2 = tcu::TextureFormat::getPixelSize(&local_388);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_320,(long)(iVar2 << 0xc),(allocator_type *)local_280);
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)&local_378,&local_388,0x40,0x40,1,
             local_308.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start);
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)&local_2a8,&local_388,0x40,0x40,1,
             local_320.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start);
  if (local_100.m_program.m_info.linkOk == false) {
    glu::operator<<((TestLog *)log,&local_100);
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Shader compile/link failed");
  }
  else {
    (*gl->bindFramebuffer)(0x8ca9,local_2c0.m_object);
    (*gl->bindFramebuffer)(0x8ca8,local_2c0.m_object);
    (*gl->bindRenderbuffer)(0x8d41,local_2d8.m_object);
    (*gl->renderbufferStorage)(0x8d41,local_380,0x40,0x40);
    (*gl->framebufferRenderbuffer)(0x8ca9,0x8ce0,0x8d41,local_2d8.m_object);
    (*gl->bindRenderbuffer)(0x8d41,local_2f0.m_object);
    (*gl->renderbufferStorage)(0x8d41,0x88f0,0x40,0x40);
    (*gl->framebufferRenderbuffer)(0x8ca9,0x821a,0x8d41,local_2f0.m_object);
    local_280 = (undefined1  [8])log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_278);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&uStack_278,"Scissor area is ",0x10);
    tcu::operator<<((ostream *)&uStack_278,&local_398);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_278);
    std::ios_base::~ios_base(local_208);
    local_280 = (undefined1  [8])log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_278);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&uStack_278,"Rendering reference (scissors disabled)",0x27);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_278);
    std::ios_base::~ios_base(local_208);
    (*gl->useProgram)(local_100.m_program.m_program);
    iVar2 = 0;
    (*gl->viewport)(0,0,0x40,0x40);
    (*gl->disable)(0xb71);
    (*gl->disable)(0xb90);
    (*gl->disable)(0xc11);
    uStack_334 = local_3a8;
    uStack_330 = local_3a4;
    uStack_32c = local_3a0;
    local_328 = local_39c;
    color.field_1.i[0] = local_3a8;
    color.type = (Type)depth;
    color.field_1.i[1] = local_3a4;
    color.field_1.i[2] = local_3a0;
    color.field_1.i[3] = local_39c;
    local_338 = depth;
    clearBuffers(gl,color,depth,iVar2);
    (*(this->super_TestCase).super_TestNode._vptr_TestNode[5])(this);
    glu::readPixels(this->m_renderCtx,0,0,(PixelBufferAccess *)&local_378);
    GVar4 = (*gl->getError)();
    glu::checkError(GVar4,(char *)0x0,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsScissorTests.cpp"
                    ,0x29e);
    local_280 = (undefined1  [8])log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_278);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&uStack_278,"Rendering result (scissors enabled)",0x23);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_278);
    std::ios_base::~ios_base(local_208);
    (*gl->useProgram)(local_100.m_program.m_program);
    iVar2 = 0;
    (*gl->viewport)(0,0,0x40,0x40);
    (*gl->disable)(0xb71);
    (*gl->disable)(0xb90);
    (*gl->disable)(0xc11);
    uStack_34c = local_3a8;
    uStack_348 = local_3a4;
    uStack_344 = local_3a0;
    local_340 = local_39c;
    color_00.field_1.i[0] = local_3a8;
    color_00.type = (Type)depth;
    color_00.field_1.i[1] = local_3a4;
    color_00.field_1.i[2] = local_3a0;
    color_00.field_1.i[3] = local_39c;
    local_350 = depth;
    clearBuffers(gl,color_00,depth,iVar2);
    (*gl->enable)(0xc11);
    (*gl->scissor)(local_398.m_data[0],local_398.m_data[1],local_398.m_data[2],local_398.m_data[3]);
    (*(this->super_TestCase).super_TestNode._vptr_TestNode[5])(this);
    glu::readPixels(this->m_renderCtx,0,0,(PixelBufferAccess *)&local_2a8);
    GVar4 = (*gl->getError)();
    glu::checkError(GVar4,(char *)0x0,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsScissorTests.cpp"
                    ,0x2b4);
    if (depth == 0.0) {
      local_280._4_4_ = local_3a4;
      local_280._0_4_ = local_3a8;
      uStack_278 = (pointer)CONCAT44(local_39c,local_3a0);
      if (0 < local_378.m_size.m_data[1]) {
        iVar2 = 0;
        do {
          if (0 < local_378.m_size.m_data[0]) {
            iVar7 = 0;
            do {
              if ((((iVar2 < local_398.m_data[1]) ||
                   (local_398.m_data[1] + local_398.m_data[3] <= iVar2)) ||
                  (iVar7 < local_398.m_data[0])) ||
                 (local_398.m_data[0] + local_398.m_data[2] <= iVar7)) {
                tcu::PixelBufferAccess::setPixel
                          ((PixelBufferAccess *)&local_378,(Vec4 *)local_280,iVar7,iVar2,0);
              }
              iVar7 = iVar7 + 1;
            } while (iVar7 < local_378.m_size.m_data[0]);
          }
          iVar2 = iVar2 + 1;
        } while (iVar2 < local_378.m_size.m_data[1]);
      }
      local_280 = (undefined1  [8])0x3ca3d70a3ca3d70a;
      uStack_278 = (pointer)0x3ca3d70a3ca3d70a;
      bVar1 = tcu::floatThresholdCompare
                        ((TestLog *)log,"ComparisonResult","Image comparison result",&local_378,
                         &local_2a8,(Vec4 *)local_280,COMPARE_LOG_RESULT);
    }
    else if (depth == 1.4013e-45) {
      local_280._4_4_ = local_3a4;
      local_280._0_4_ = local_3a8;
      uStack_278 = (pointer)CONCAT44(local_39c,local_3a0);
      Functional::(anonymous_namespace)::clearEdges<tcu::Vector<int,4>>
                ((PixelBufferAccess *)&local_378,(Vector<int,_4> *)local_280,&local_398);
      local_280 = (undefined1  [8])0x200000002;
      uStack_278 = (pointer)0x200000002;
      bVar1 = tcu::intThresholdCompare
                        ((TestLog *)log,"ComparisonResult","Image comparison result",&local_378,
                         &local_2a8,(UVec4 *)local_280,COMPARE_LOG_RESULT);
    }
    else {
      if (0 < local_378.m_size.m_data[1]) {
        iVar2 = 0;
        do {
          if (0 < local_378.m_size.m_data[0]) {
            iVar7 = 0;
            do {
              if (((iVar2 < local_398.m_data[1]) ||
                  (local_398.m_data[1] + local_398.m_data[3] <= iVar2)) ||
                 ((iVar7 < local_398.m_data[0] ||
                  (local_398.m_data[0] + local_398.m_data[2] <= iVar7)))) {
                local_280._4_4_ = local_3a4;
                local_280._0_4_ = local_3a8;
                uStack_278 = (pointer)CONCAT44(local_39c,local_3a0);
                tcu::PixelBufferAccess::setPixel
                          ((PixelBufferAccess *)&local_378,(IVec4 *)local_280,iVar7,iVar2,0);
              }
              iVar7 = iVar7 + 1;
            } while (iVar7 < local_378.m_size.m_data[0]);
          }
          iVar2 = iVar2 + 1;
        } while (iVar2 < local_378.m_size.m_data[1]);
      }
      local_280 = (undefined1  [8])0x200000002;
      uStack_278 = (pointer)0x200000002;
      bVar1 = tcu::intThresholdCompare
                        ((TestLog *)log,"ComparisonResult","Image comparison result",&local_378,
                         &local_2a8,(UVec4 *)local_280,COMPARE_LOG_RESULT);
    }
    description = "Image comparison failed";
    if (bVar1 != false) {
      description = "Pass";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestNode.m_testCtx,(uint)(bVar1 ^ 1),description);
  }
  if (local_320.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_320.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_320.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_320.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_308.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_308.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_308.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_308.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  glu::ObjectWrapper::~ObjectWrapper(&local_2f0);
  glu::ObjectWrapper::~ObjectWrapper(&local_2d8);
  glu::ObjectWrapper::~ObjectWrapper(&local_2c0);
  glu::ShaderProgram::~ShaderProgram(&local_100);
  return STOP;
}

Assistant:

FramebufferClearCase::IterateResult FramebufferClearCase::iterate (void)
{
	TestLog&					log				= m_testCtx.getLog();
	const glw::Functions&		gl				= m_renderCtx.getFunctions();
	const glu::ShaderProgram	shader			(m_renderCtx, genShaders(glu::getContextTypeGLSLVersion(m_renderCtx.getType())));

	const glu::Framebuffer		fbo				(gl);
	const glu::Renderbuffer		colorbuf		(gl);
	const glu::Renderbuffer		depthbuf		(gl);

	const BufferFmtDesc			bufferFmt		= getBufferFormat(m_clearType);
	const Color					baseColor		= getBaseColor(bufferFmt);

	const int					width			= 64;
	const int					height			= 64;

	const IVec4					scissorArea		(8, 8, 48, 48);

	vector<deUint8>				refData			(width*height*bufferFmt.texFmt.getPixelSize());
	vector<deUint8>				resData			(width*height*bufferFmt.texFmt.getPixelSize());

	tcu::PixelBufferAccess		refAccess		(bufferFmt.texFmt, width, height, 1, &refData[0]);
	tcu::PixelBufferAccess		resAccess		(bufferFmt.texFmt, width, height, 1, &resData[0]);

	if (!shader.isOk())
	{
		log << shader;
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Shader compile/link failed");
		return STOP;
	}

	gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, *fbo);
	gl.bindFramebuffer(GL_READ_FRAMEBUFFER, *fbo);

	// Color
	gl.bindRenderbuffer(GL_RENDERBUFFER, *colorbuf);
	gl.renderbufferStorage(GL_RENDERBUFFER, bufferFmt.colorFmt, width, height);
	gl.framebufferRenderbuffer(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, *colorbuf);

	// Depth/stencil
	gl.bindRenderbuffer(GL_RENDERBUFFER, *depthbuf);
	gl.renderbufferStorage(GL_RENDERBUFFER, GL_DEPTH24_STENCIL8, width, height);
	gl.framebufferRenderbuffer(GL_DRAW_FRAMEBUFFER, GL_DEPTH_STENCIL_ATTACHMENT, GL_RENDERBUFFER, *depthbuf);

	log << TestLog::Message << "Scissor area is " << scissorArea << TestLog::EndMessage;

	// Render reference
	{
		log << TestLog::Message << "Rendering reference (scissors disabled)" << TestLog::EndMessage;

		gl.useProgram(shader.getProgram());
		gl.viewport(0, 0, width, height);

		gl.disable(GL_DEPTH_TEST);
		gl.disable(GL_STENCIL_TEST);
		gl.disable(GL_SCISSOR_TEST);

		clearBuffers(gl, baseColor, 1.0f, 0);

		render(shader.getProgram());

		glu::readPixels(m_renderCtx, 0, 0, refAccess);
		GLU_CHECK_ERROR(gl.getError());
	}

	// Render result
	{
		log << TestLog::Message << "Rendering result (scissors enabled)" << TestLog::EndMessage;

		gl.useProgram(shader.getProgram());
		gl.viewport(0, 0, width, height);

		gl.disable(GL_DEPTH_TEST);
		gl.disable(GL_STENCIL_TEST);
		gl.disable(GL_SCISSOR_TEST);

		clearBuffers(gl, baseColor, 1.0f, 0);

		gl.enable(GL_SCISSOR_TEST);
		gl.scissor(scissorArea.x(), scissorArea.y(), scissorArea.z(), scissorArea.w());

		render(shader.getProgram());

		glu::readPixels(m_renderCtx, 0, 0, resAccess);
		GLU_CHECK_ERROR(gl.getError());
	}

	{
		bool resultOk = false;

		switch (baseColor.type)
		{
			case Color::FLOAT:
				clearEdges(refAccess, Vec4(baseColor.f[0], baseColor.f[1], baseColor.f[2], baseColor.f[3]), scissorArea);
				resultOk = tcu::floatThresholdCompare(log, "ComparisonResult", "Image comparison result", refAccess, resAccess, Vec4(0.02f, 0.02f, 0.02f, 0.02f), tcu::COMPARE_LOG_RESULT);
				break;

			case Color::INT:
				clearEdges(refAccess, IVec4(baseColor.i[0], baseColor.i[1], baseColor.i[2], baseColor.i[3]), scissorArea);
				resultOk = tcu::intThresholdCompare(log, "ComparisonResult", "Image comparison result", refAccess, resAccess, UVec4(2, 2, 2, 2), tcu::COMPARE_LOG_RESULT);
				break;

			case Color::UINT:
				clearEdges(refAccess, UVec4(baseColor.u[0], baseColor.u[1], baseColor.u[2], baseColor.u[3]), scissorArea);
				resultOk = tcu::intThresholdCompare(log, "ComparisonResult", "Image comparison result", refAccess, resAccess, UVec4(2, 2, 2, 2), tcu::COMPARE_LOG_RESULT);
				break;
		}

		if (resultOk)
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");
	}

	return STOP;
}